

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetTestPropertyCommand::Clone(cmGetTestPropertyCommand *this)

{
  cmCommand *this_00;
  cmGetTestPropertyCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmGetTestPropertyCommand((cmGetTestPropertyCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmGetTestPropertyCommand; }